

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O2

int __thiscall zmq::context_t::close(context_t *this,int __fd)

{
  int in_EAX;
  int *piVar1;
  
  if (this->ptr != (void *)0x0) {
    do {
      piVar1 = (int *)zmq_ctx_destroy(this->ptr);
      if ((int)piVar1 != -1) break;
      piVar1 = __errno_location();
    } while (*piVar1 == 4);
    in_EAX = (int)piVar1;
    this->ptr = (void *)0x0;
  }
  return in_EAX;
}

Assistant:

void close() ZMQ_NOTHROW
    {
        if (ptr == ZMQ_NULLPTR)
            return;

        int rc;
        do {
            rc = zmq_ctx_destroy(ptr);
        } while (rc == -1 && errno == EINTR);

        ZMQ_ASSERT(rc == 0);
        ptr = ZMQ_NULLPTR;
    }